

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp3
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp,JnHelperMethod helperMethodLeftDead)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 in_EAX;
  RegOpnd *pRVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  undefined4 uStack_38;
  JnHelperMethod local_34;
  
  _uStack_38 = CONCAT44(helperMethodLeftDead,in_EAX);
  this_00 = instr->m_src1;
  bVar2 = IR::Opnd::IsRegOpnd(this_00);
  if ((bVar2) && (pRVar3 = IR::Opnd::AsRegOpnd(this_00), (pRVar3->field_0x18 & 1) != 0)) {
    uStack_38 = CONCAT22((this_00->m_valueType).field_0.bits,(undefined2)uStack_38);
    bVar2 = ValueType::IsNotString((ValueType *)((long)&uStack_38 + 2));
    if (!bVar2) {
      if (local_34 != 0x4c) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2315,"(helperMethodLeftDead == IR::HelperOp_AddLeftDead)",
                           "helperMethodLeftDead == IR::HelperOp_AddLeftDead");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      pIVar4 = LowerAddLeftDeadForString(this,instr);
      return pIVar4;
    }
  }
  pIVar4 = LowerBinaryHelperMemWithTemp2(this,instr,helperMethod,helperMethodWithTemp);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp3(IR::Instr *instr, IR::JnHelperMethod helperMethod, IR::JnHelperMethod helperMethodWithTemp, IR::JnHelperMethod helperMethodLeftDead)
{
    IR::Opnd *src1 = instr->GetSrc1();

    if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_isTempLastUse && !src1->GetValueType().IsNotString())
    {
        Assert(helperMethodLeftDead == IR::HelperOp_AddLeftDead);
        return LowerAddLeftDeadForString(instr);
    }
    else
    {
        return this->LowerBinaryHelperMemWithTemp2(instr, helperMethod, helperMethodWithTemp);
    }
}